

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void TestEq<unsigned_int,unsigned_int>(uint expval,uint val,char *exp,char *file,int line)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 local_68 [8];
  string val_str;
  string expval_str;
  int line_local;
  char *file_local;
  char *exp_local;
  uint val_local;
  uint expval_local;
  
  if (expval != val) {
    flatbuffers::NumToString<unsigned_int>((string *)((long)&val_str.field_2 + 8),expval);
    flatbuffers::NumToString<unsigned_int>((string *)local_68,val);
    uVar1 = std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::c_str();
    printf("TEST FAILED: %s:%d, %s (%s) != %s",file,(ulong)(uint)line,exp,uVar1,uVar2);
    printf("\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/tests/test.cpp"
                  ,0x2d,
                  "void TestEq(T, U, const char *, const char *, int) [T = unsigned int, U = unsigned int]"
                 );
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line) {
  if (expval != val) {
    auto expval_str = flatbuffers::NumToString(expval);
    auto val_str = flatbuffers::NumToString(val);
    TEST_OUTPUT_LINE("TEST FAILED: %s:%d, %s (%s) != %s", file, line,
                     exp, expval_str.c_str(), val_str.c_str());
    assert(0);
    testing_fails++;
  }
}